

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

uint get_bits_MSB(cram_block *block,int nbits)

{
  int iVar1;
  int local_24;
  uint local_20;
  int i;
  uint val;
  int nbits_local;
  cram_block *block_local;
  
  local_20 = 0;
  if (block->bit + 1 < nbits) {
    switch(nbits) {
    case 8:
      local_20 = (int)(uint)block->data[block->byte] >> ((byte)block->bit & 0x1f) & 1;
      iVar1 = block->bit + -1;
      block->bit = iVar1;
      block->byte = (long)(int)(uint)(iVar1 < 0) + block->byte;
      block->bit = block->bit & 7;
    case 7:
      local_20 = (int)(uint)block->data[block->byte] >> ((byte)block->bit & 0x1f) & 1U |
                 local_20 << 1;
      iVar1 = block->bit + -1;
      block->bit = iVar1;
      block->byte = (long)(int)(uint)(iVar1 < 0) + block->byte;
      block->bit = block->bit & 7;
    case 6:
      local_20 = (int)(uint)block->data[block->byte] >> ((byte)block->bit & 0x1f) & 1U |
                 local_20 << 1;
      iVar1 = block->bit + -1;
      block->bit = iVar1;
      block->byte = (long)(int)(uint)(iVar1 < 0) + block->byte;
      block->bit = block->bit & 7;
    case 5:
      local_20 = (int)(uint)block->data[block->byte] >> ((byte)block->bit & 0x1f) & 1U |
                 local_20 << 1;
      iVar1 = block->bit + -1;
      block->bit = iVar1;
      block->byte = (long)(int)(uint)(iVar1 < 0) + block->byte;
      block->bit = block->bit & 7;
    case 4:
      local_20 = (int)(uint)block->data[block->byte] >> ((byte)block->bit & 0x1f) & 1U |
                 local_20 << 1;
      iVar1 = block->bit + -1;
      block->bit = iVar1;
      block->byte = (long)(int)(uint)(iVar1 < 0) + block->byte;
      block->bit = block->bit & 7;
    case 3:
      local_20 = (int)(uint)block->data[block->byte] >> ((byte)block->bit & 0x1f) & 1U |
                 local_20 << 1;
      iVar1 = block->bit + -1;
      block->bit = iVar1;
      block->byte = (long)(int)(uint)(iVar1 < 0) + block->byte;
      block->bit = block->bit & 7;
    case 2:
      local_20 = (int)(uint)block->data[block->byte] >> ((byte)block->bit & 0x1f) & 1U |
                 local_20 << 1;
      iVar1 = block->bit + -1;
      block->bit = iVar1;
      block->byte = (long)(int)(uint)(iVar1 < 0) + block->byte;
      block->bit = block->bit & 7;
    case 1:
      local_20 = (int)(uint)block->data[block->byte] >> ((byte)block->bit & 0x1f) & 1U |
                 local_20 << 1;
      iVar1 = block->bit + -1;
      block->bit = iVar1;
      block->byte = (long)(int)(uint)(iVar1 < 0) + block->byte;
      block->bit = block->bit & 7;
      break;
    default:
      for (local_24 = 0; local_24 < nbits; local_24 = local_24 + 1) {
        local_20 = (int)(uint)block->data[block->byte] >> ((byte)block->bit & 0x1f) & 1U |
                   local_20 << 1;
        iVar1 = block->bit + -1;
        block->bit = iVar1;
        block->byte = (long)(int)(uint)(iVar1 < 0) + block->byte;
        block->bit = block->bit & 7;
      }
    }
    block_local._4_4_ = local_20;
  }
  else {
    block_local._4_4_ =
         (int)(uint)block->data[block->byte] >> ((char)block->bit - ((byte)nbits - 1) & 0x1f) &
         (1 << ((byte)nbits & 0x1f)) - 1U;
    iVar1 = block->bit - nbits;
    block->bit = iVar1;
    if (iVar1 == -1) {
      block->bit = 7;
      block->byte = block->byte + 1;
    }
  }
  return block_local._4_4_;
}

Assistant:

static inline unsigned int get_bits_MSB(cram_block *block, int nbits) {
    unsigned int val = 0;
    int i;

#if 0
    // Fits within the current byte */
    if (nbits <= block->bit+1) {
	val = (block->data[block->byte]>>(block->bit-(nbits-1))) & ((1<<nbits)-1);
	if ((block->bit -= nbits) == -1) {
	    block->bit = 7;
	    block->byte++;
	}
	return val;
    }

    // partial first byte
    val = block->data[block->byte] & ((1<<(block->bit+1))-1);
    nbits -= block->bit+1;
    block->bit = 7;
    block->byte++;

    // whole middle bytes
    while (nbits >= 8) {
	val = (val << 8) | block->data[block->byte++];
	nbits -= 8;
    }

    val <<= nbits;
    val |= (block->data[block->byte]>>(block->bit-(nbits-1))) & ((1<<nbits)-1);
    block->bit -= nbits;
    return val;
#endif

#if 0
    /* Inefficient implementation! */
    //printf("{");
    for (i = 0; i < nbits; i++)
	//val = (val << 1) | get_bit_MSB(block);
	GET_BIT_MSB(block, val);
#endif

#if 1
    /* Combination of 1st two methods */
    if (nbits <= block->bit+1) {
	val = (block->data[block->byte]>>(block->bit-(nbits-1))) & ((1<<nbits)-1);
	if ((block->bit -= nbits) == -1) {
	    block->bit = 7;
	    block->byte++;
	}
	return val;
    }

    switch(nbits) {
//    case 15: GET_BIT_MSB(block, val);
//    case 14: GET_BIT_MSB(block, val);
//    case 13: GET_BIT_MSB(block, val);
//    case 12: GET_BIT_MSB(block, val);
//    case 11: GET_BIT_MSB(block, val);
//    case 10: GET_BIT_MSB(block, val);
//    case  9: GET_BIT_MSB(block, val);
    case  8: GET_BIT_MSB(block, val);
    case  7: GET_BIT_MSB(block, val);
    case  6: GET_BIT_MSB(block, val);
    case  5: GET_BIT_MSB(block, val);
    case  4: GET_BIT_MSB(block, val);
    case  3: GET_BIT_MSB(block, val);
    case  2: GET_BIT_MSB(block, val);
    case  1: GET_BIT_MSB(block, val);
	break;

    default:
	for (i = 0; i < nbits; i++)
	    //val = (val << 1) | get_bit_MSB(block);
	    GET_BIT_MSB(block, val);
    }
#endif

    //printf("=0x%x}", val);

    return val;
}